

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_proj.c
# Opt level: O0

int CVodeSetProjFn(void *cvode_mem,CVProjFn pfun)

{
  CVodeProjMem pCVar1;
  int iVar2;
  CVProjFn in_RSI;
  CVodeMem in_RDI;
  CVodeProjMem proj_mem;
  CVodeMem cv_mem;
  int retval;
  CVodeProjMem *in_stack_ffffffffffffffc8;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVodeSetProjFn","cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RSI == (CVProjFn)0x0) {
    cvProcessError(in_RDI,-0x16,"CVODE","CVodeSetProjFn","The projection function is NULL.");
    local_4 = -0x16;
  }
  else if (in_RDI->cv_lmm == 2) {
    iVar2 = cvProjCreate(in_stack_ffffffffffffffc8);
    if (iVar2 == 0) {
      pCVar1 = in_RDI->proj_mem;
      pCVar1->internal_proj = 0;
      pCVar1->pfun = in_RSI;
      in_RDI->proj_enabled = 1;
      local_4 = 0;
    }
    else {
      cvProcessError(in_RDI,-0x14,"CVODE","CVodeSetProjFn","A memory request failed.");
      local_4 = -0x14;
    }
  }
  else {
    cvProcessError(in_RDI,-0x16,"CVODE","CVodeSetProjFn",
                   "Projection is only supported with BDF methods.");
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int CVodeSetProjFn(void *cvode_mem, CVProjFn pfun)
{
  int          retval;
  CVodeMem     cv_mem;
  CVodeProjMem proj_mem;

  /* Check the CVODE memory pointer */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeSetProjFn",
                   MSG_CV_MEM_NULL);
    return(CV_MEM_NULL);
  }
  cv_mem = (CVodeMem) cvode_mem;

  /* Check if the projection function is NULL */
  if (pfun == NULL)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVodeSetProjFn",
                   "The projection function is NULL.");
    return(CV_ILL_INPUT);
  }

  /* Check for compatible method */
  if (cv_mem->cv_lmm != CV_BDF)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVodeSetProjFn",
                   "Projection is only supported with BDF methods.");
    return(CV_ILL_INPUT);
  }

  /* Create the projection memory (if necessary) */
  retval = cvProjCreate(&(cv_mem->proj_mem));
  if (retval != CV_SUCCESS)
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, "CVODE", "CVodeSetProjFn",
                   MSG_CV_MEM_FAIL);
    return(CV_MEM_FAIL);
  }

  /* Shortcut to projection memory */
  proj_mem = cv_mem->proj_mem;

  /* User-defined projection */
  proj_mem->internal_proj = SUNFALSE;

  /* Set the projection function */
  proj_mem->pfun = pfun;

  /* Enable projection */
  cv_mem->proj_enabled = SUNTRUE;

  return(CV_SUCCESS);
}